

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O0

bool vera::intersection(vec2 *_line1Start,vec2 *_line1End,vec2 *_line2Start,vec2 *_line2End,
                       vec2 *_intersection)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec<2,_float,_(glm::qualifier)0> vVar4;
  vec<2,_float,_(glm::qualifier)0> vVar5;
  double lDetDivInv;
  double compareB;
  double compareA;
  vec2 diffLB;
  vec2 diffLA;
  vec2 *_intersection_local;
  vec2 *_line2End_local;
  vec2 *_line2Start_local;
  vec2 *_line1End_local;
  vec2 *_line1Start_local;
  
  vVar4 = glm::operator-(_line1End,_line1Start);
  vVar5 = glm::operator-(_line2End,_line2Start);
  diffLB.field_0 = vVar4.field_0;
  diffLB.field_1 = vVar4.field_1;
  fVar1 = diffLB.field_0.x * (_line1Start->field_1).y +
          -(diffLB.field_1.y * (_line1Start->field_0).x);
  compareA._0_4_ = vVar5.field_0;
  compareA._4_4_ = vVar5.field_1;
  fVar2 = compareA._0_4_ * (_line2Start->field_1).y + -(compareA._4_4_ * (_line2Start->field_0).x);
  if ((diffLB.field_0.x * (_line2Start->field_1).y + -(diffLB.field_1.y * (_line2Start->field_0).x)
       < fVar1 ==
       diffLB.field_0.x * (_line2End->field_1).y + -(diffLB.field_1.y * (_line2End->field_0).x) <
       fVar1) ||
     (compareA._0_4_ * (_line1Start->field_1).y + -(compareA._4_4_ * (_line1Start->field_0).x) <
      fVar2 == compareA._0_4_ * (_line1End->field_1).y + -(compareA._4_4_ * (_line1End->field_0).x)
               < fVar2)) {
    _line1Start_local._7_1_ = false;
  }
  else {
    fVar3 = 1.0 / (diffLB.field_0.x * compareA._4_4_ + -(diffLB.field_1.y * compareA._0_4_));
    (_intersection->field_0).x = -(diffLB.field_0.x * fVar2 + -(fVar1 * compareA._0_4_)) * fVar3;
    (_intersection->field_1).y = -(diffLB.field_1.y * fVar2 + -(fVar1 * compareA._4_4_)) * fVar3;
    _line1Start_local._7_1_ = true;
  }
  return _line1Start_local._7_1_;
}

Assistant:

bool intersection(  const glm::vec2 &_line1Start, const glm::vec2 &_line1End,
                    const glm::vec2 &_line2Start, const glm::vec2 &_line2End,
                    glm::vec2 &_intersection ) {
    glm::vec2 diffLA, diffLB;
    double compareA, compareB;
    diffLA = _line1End - _line1Start;
    diffLB = _line2End - _line2Start;
    compareA = diffLA.x*_line1Start.y - diffLA.y*_line1Start.x;
    compareB = diffLB.x*_line2Start.y - diffLB.y*_line2Start.x;
    if (
        (
         ( ( diffLA.x*_line2Start.y - diffLA.y*_line2Start.x ) < compareA ) ^
         ( ( diffLA.x*_line2End.y - diffLA.y*_line2End.x ) < compareA )
         )
        &&
        (
         ( ( diffLB.x*_line1Start.y - diffLB.y*_line1Start.x ) < compareB ) ^
         ( ( diffLB.x*_line1End.y - diffLB.y*_line1End.x) < compareB )
         )
        )
    {
        double lDetDivInv = 1 / ((diffLA.x*diffLB.y) - (diffLA.y*diffLB.x));
        _intersection.x =  -((diffLA.x*compareB) - (compareA*diffLB.x)) * lDetDivInv ;
        _intersection.y =  -((diffLA.y*compareB) - (compareA*diffLB.y)) * lDetDivInv ;
        
        return true;
    }
    
    return false;
}